

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O3

EStatusCode __thiscall
DecryptionHelper::Setup(DecryptionHelper *this,PDFParser *inParser,string *inPassword)

{
  ByteList *inO;
  StringToXCryptionCommonMap *this_00;
  _Rb_tree_header *p_Var1;
  ByteList *inFileIDPart1;
  size_t *psVar2;
  _Base_ptr p_Var3;
  string *psVar4;
  pointer pcVar5;
  _List_node_base *p_Var6;
  iteratorType iVar7;
  _List_node_base *p_Var8;
  PDFName *pPVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  PDFDictionary *pPVar13;
  PDFObject *pPVar14;
  string *psVar15;
  Trace *pTVar16;
  longlong lVar17;
  unsigned_long uVar18;
  XCryptionCommon *pXVar19;
  const_iterator cVar20;
  ByteList password;
  PDFObjectCastPtr<PDFDictionary> encryptionDictionary;
  PDFObjectCastPtr<PDFName> streamsFilterName;
  PDFObjectCastPtr<PDFName> stringsFilterName;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  cryptFiltersIt;
  ParsedPrimitiveHelper idPart1ObjectHelper;
  RefCountPtr<PDFObject> length;
  RefCountPtr<PDFObject> p;
  RefCountPtr<PDFObject> u;
  PDFObjectCastPtr<PDFName> filter;
  PDFObjectCastPtr<PDFArray> idArray;
  RefCountPtr<PDFObject> lengthObject;
  PDFObjectCastPtr<PDFBoolean> encryptMetadata;
  RefCountPtr<PDFObject> o;
  RefCountPtr<PDFObject> revision;
  RefCountPtr<PDFObject> v;
  
  this->mSupportsDecryption = false;
  this->mFailedPasswordVerification = false;
  this->mDidSucceedOwnerPasswordVerification = false;
  this->mParser = inParser;
  pPVar13 = PDFParser::GetTrailer(inParser);
  psVar2 = &password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node
            ._M_size;
  password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&password,"Encrypt","");
  pPVar14 = PDFParser::QueryDictionaryObject(inParser,pPVar13,(string *)&password);
  encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue =
       PDFObjectCast<PDFDictionary>(pPVar14);
  encryptionDictionary.super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_003a58a0;
  if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)psVar2) {
    operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node.super__List_node_base._M_next,
                    password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node._M_size + 1);
  }
  pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
  this->mIsEncrypted =
       encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue != (PDFDictionary *)0x0;
  if (encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue == (PDFDictionary *)0x0)
  goto LAB_002029c7;
  password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&password,"Filter","");
  pPVar14 = PDFParser::QueryDictionaryObject(inParser,pPVar13,(string *)&password);
  filter.super_RefCountPtr<PDFName>.mValue = PDFObjectCast<PDFName>(pPVar14);
  filter.super_RefCountPtr<PDFName>._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5978;
  if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)psVar2) {
    operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node.super__List_node_base._M_next,
                    password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node._M_size + 1);
  }
  if (filter.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0) {
LAB_00201c63:
    pTVar16 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar16,"DecryptionHelper::Setup, no filter defined");
  }
  else {
    psVar15 = PDFName::GetValue_abi_cxx11_(filter.super_RefCountPtr<PDFName>.mValue);
    iVar11 = std::__cxx11::string::compare((char *)psVar15);
    pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
    if (iVar11 == 0) {
      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)psVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&password,"V","");
      v.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar13,(string *)&password);
      v._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
      if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next,
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node._M_size + 1);
      }
      if (v.mValue == (PDFObject *)0x0) {
        this->mV = 0;
LAB_0020210f:
        pTVar16 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar16,
                          "DecryptionHelper::Setup, Only 1 and 2 are supported values for V. Unsupported filter encountered - %d"
                          ,(ulong)this->mV);
      }
      else {
        ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password,v.mValue);
        bVar10 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
        if (bVar10) {
          lVar17 = ParsedPrimitiveHelper::GetAsInteger((ParsedPrimitiveHelper *)&password);
          this->mV = (uint)lVar17;
          ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
          pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
          if ((4 < this->mV) || ((0x16U >> (this->mV & 0x1f) & 1) == 0)) goto LAB_0020210f;
          password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)psVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&password,"R","");
          revision.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar13,(string *)&password);
          revision._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
          if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              _M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
            operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next,
                            password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node._M_size + 1);
          }
          if (revision.mValue != (PDFObject *)0x0) {
            ParsedPrimitiveHelper::ParsedPrimitiveHelper
                      ((ParsedPrimitiveHelper *)&password,revision.mValue);
            bVar10 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
            if (bVar10) {
              lVar17 = ParsedPrimitiveHelper::GetAsInteger((ParsedPrimitiveHelper *)&password);
              this->mRevision = (uint)lVar17;
              ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
              pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
              password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&password,"O","");
              o.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar13,(string *)&password);
              o._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
              if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  _M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                operator_delete(password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next,
                                password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node._M_size + 1);
              }
              if (o.mValue != (PDFObject *)0x0) {
                ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&u,o.mValue);
                ParsedPrimitiveHelper::ToString_abi_cxx11_
                          ((string *)&password,(ParsedPrimitiveHelper *)&u);
                XCryptionCommon::stringToByteList((ByteList *)&cryptFiltersIt,(string *)&password);
                inO = &this->mO;
                std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                          (inO,(_Base_ptr)&cryptFiltersIt);
                iVar7 = cryptFiltersIt.
                        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        .mEndPosition;
                while (iVar7._M_node != (_Base_ptr)&cryptFiltersIt) {
                  p_Var3 = *iVar7._M_node;
                  operator_delete(iVar7._M_node,0x18);
                  iVar7._M_node = p_Var3;
                }
                if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                  operator_delete(password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next,
                                  password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node._M_size + 1);
                }
                ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&u);
                pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&password,"U","");
                u.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar13,(string *)&password);
                u._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
                if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                  operator_delete(password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next,
                                  password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node._M_size + 1);
                }
                if (u.mValue != (PDFObject *)0x0) {
                  ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&p,u.mValue)
                  ;
                  ParsedPrimitiveHelper::ToString_abi_cxx11_
                            ((string *)&password,(ParsedPrimitiveHelper *)&p);
                  XCryptionCommon::stringToByteList((ByteList *)&cryptFiltersIt,(string *)&password)
                  ;
                  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                            (&this->mU,(_Base_ptr)&cryptFiltersIt);
                  iVar7 = cryptFiltersIt.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                          .mEndPosition;
                  while (iVar7._M_node != (_Base_ptr)&cryptFiltersIt) {
                    p_Var3 = *iVar7._M_node;
                    operator_delete(iVar7._M_node,0x18);
                    iVar7._M_node = p_Var3;
                  }
                  if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                    operator_delete(password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node.super__List_node_base._M_next,
                                    password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node._M_size + 1);
                  }
                  ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&p);
                  pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                  password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&password,"P","");
                  p.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar13,(string *)&password);
                  p._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
                  if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                    operator_delete(password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node.super__List_node_base._M_next,
                                    password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node._M_size + 1);
                  }
                  if (p.mValue != (PDFObject *)0x0) {
                    ParsedPrimitiveHelper::ParsedPrimitiveHelper
                              ((ParsedPrimitiveHelper *)&password,p.mValue);
                    bVar10 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
                    if (bVar10) {
                      lVar17 = ParsedPrimitiveHelper::GetAsInteger
                                         ((ParsedPrimitiveHelper *)&password);
                      this->mP = lVar17;
                      ParsedPrimitiveHelper::~ParsedPrimitiveHelper
                                ((ParsedPrimitiveHelper *)&password);
                      pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&password,"EncryptMetadata","");
                      pPVar14 = PDFParser::QueryDictionaryObject
                                          (inParser,pPVar13,(string *)&password);
                      encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue =
                           PDFObjectCast<PDFBoolean>(pPVar14);
                      encryptMetadata.super_RefCountPtr<PDFBoolean>._vptr_RefCountPtr =
                           (_func_int **)&PTR__RefCountPtr_003a7108;
                      if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2
                         ) {
                        operator_delete(password.
                                        super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl._M_node.super__List_node_base._M_next,
                                        password.
                                        super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl._M_node._M_size + 1);
                      }
                      if (encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue == (PDFBoolean *)0x0)
                      {
                        this->mEncryptMetaData = true;
                      }
                      else {
                        bVar10 = PDFBoolean::GetValue
                                           (encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue);
                        this->mEncryptMetaData = bVar10;
                      }
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node._M_size = 0;
                      inFileIDPart1 = &this->mFileIDPart1;
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&password;
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&password;
                      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_move_assign(inFileIDPart1,(string *)&password);
                      psVar15 = (string *)
                                password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next;
                      while (psVar15 != (string *)&password) {
                        psVar4 = (string *)(psVar15->_M_dataplus)._M_p;
                        operator_delete(psVar15,0x18);
                        psVar15 = psVar4;
                      }
                      pPVar13 = PDFParser::GetTrailer(inParser);
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&password,"ID","");
                      pPVar14 = PDFParser::QueryDictionaryObject
                                          (inParser,pPVar13,(string *)&password);
                      idArray.super_RefCountPtr<PDFArray>.mValue = PDFObjectCast<PDFArray>(pPVar14);
                      idArray.super_RefCountPtr<PDFArray>._vptr_RefCountPtr =
                           (_func_int **)&PTR__RefCountPtr_003a58d8;
                      if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2
                         ) {
                        operator_delete(password.
                                        super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl._M_node.super__List_node_base._M_next,
                                        password.
                                        super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl._M_node._M_size + 1);
                      }
                      if ((idArray.super_RefCountPtr<PDFArray>.mValue != (PDFArray *)0x0) &&
                         (uVar18 = PDFArray::GetLength(idArray.super_RefCountPtr<PDFArray>.mValue),
                         uVar18 != 0)) {
                        length.mValue =
                             PDFParser::QueryArrayObject
                                       (inParser,idArray.super_RefCountPtr<PDFArray>.mValue,0);
                        length._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
                        if (length.mValue != (PDFObject *)0x0) {
                          ParsedPrimitiveHelper::ParsedPrimitiveHelper
                                    (&idPart1ObjectHelper,length.mValue);
                          ParsedPrimitiveHelper::ToString_abi_cxx11_
                                    ((string *)&password,&idPart1ObjectHelper);
                          XCryptionCommon::stringToByteList
                                    ((ByteList *)&cryptFiltersIt,(string *)&password);
                          std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::
                          _M_move_assign(inFileIDPart1,(_Base_ptr)&cryptFiltersIt);
                          iVar7 = cryptFiltersIt.
                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                  .mEndPosition;
                          while (iVar7._M_node != (_Base_ptr)&cryptFiltersIt) {
                            p_Var3 = *iVar7._M_node;
                            operator_delete(iVar7._M_node,0x18);
                            iVar7._M_node = p_Var3;
                          }
                          if (password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next !=
                              (_List_node_base *)psVar2) {
                            operator_delete(password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node.super__List_node_base._M_next,
                                            password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node._M_size + 1);
                          }
                          ParsedPrimitiveHelper::~ParsedPrimitiveHelper(&idPart1ObjectHelper);
                        }
                        RefCountPtr<PDFObject>::~RefCountPtr(&length);
                      }
                      pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&password,"Length","");
                      length.mValue =
                           PDFParser::QueryDictionaryObject(inParser,pPVar13,(string *)&password);
                      length._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
                      if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2
                         ) {
                        operator_delete(password.
                                        super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl._M_node.super__List_node_base._M_next,
                                        password.
                                        super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl._M_node._M_size + 1);
                      }
                      if (length.mValue == (PDFObject *)0x0) {
                        uVar12 = 5;
                      }
                      else {
                        uVar12 = ComputeByteLength(length.mValue);
                      }
                      pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                      this->mLength = uVar12;
                      if (this->mV == 4) {
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&password,"CF","")
                        ;
                        pPVar14 = PDFParser::QueryDictionaryObject
                                            (inParser,pPVar13,(string *)&password);
                        pPVar13 = PDFObjectCast<PDFDictionary>(pPVar14);
                        idPart1ObjectHelper.mWrappedObject = (PDFObject *)&PTR__RefCountPtr_003a58a0
                        ;
                        if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)psVar2) {
                          operator_delete(password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node.super__List_node_base._M_next,
                                          password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node._M_size + 1);
                        }
                        if (pPVar13 != (PDFDictionary *)0x0) {
                          PDFDictionary::GetIterator(&cryptFiltersIt,pPVar13);
                          if (cryptFiltersIt.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node !=
                              cryptFiltersIt.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mEndPosition._M_node) {
                            do {
                              iVar7._M_node =
                                   cryptFiltersIt.
                                   super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                   .mEndPosition._M_node;
                              if (cryptFiltersIt.
                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                  .mFirstMove == true) {
                                cryptFiltersIt.
                                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                .mFirstMove = false;
                              }
                              else {
                                cryptFiltersIt.
                                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                .mCurrentPosition._M_node =
                                     (_Base_ptr)
                                     std::_Rb_tree_increment
                                               (cryptFiltersIt.
                                                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                .mCurrentPosition._M_node);
                                if (cryptFiltersIt.
                                    super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                    .mCurrentPosition._M_node == iVar7._M_node) break;
                              }
                              streamsFilterName.super_RefCountPtr<PDFName>.mValue = (PDFName *)0x0;
                              streamsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                                   (_func_int **)&PTR__RefCountPtr_003a58a0;
                              pPVar13 = PDFObjectCast<PDFDictionary>
                                                  ((PDFObject *)
                                                   cryptFiltersIt.
                                                                                                      
                                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                  .mCurrentPosition._M_node[1]._M_parent);
                              RefCountPtr<PDFDictionary>::operator=
                                        ((RefCountPtr<PDFDictionary> *)&streamsFilterName,pPVar13);
                              pPVar9 = streamsFilterName.super_RefCountPtr<PDFName>.mValue;
                              if (streamsFilterName.super_RefCountPtr<PDFName>.mValue !=
                                  (PDFName *)0x0) {
                                password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next =
                                     (_List_node_base *)psVar2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&password,"CFM","");
                                pPVar14 = PDFParser::QueryDictionaryObject
                                                    (inParser,(PDFDictionary *)pPVar9,
                                                     (string *)&password);
                                stringsFilterName.super_RefCountPtr<PDFName>.mValue =
                                     PDFObjectCast<PDFName>(pPVar14);
                                stringsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                                     (_func_int **)&PTR__RefCountPtr_003a5978;
                                if (password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node.super__List_node_base._M_next !=
                                    (_List_node_base *)psVar2) {
                                  operator_delete(password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                  password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node._M_size + 1);
                                }
                                pPVar9 = streamsFilterName.super_RefCountPtr<PDFName>.mValue;
                                password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next =
                                     (_List_node_base *)psVar2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&password,"Length","");
                                lengthObject.mValue =
                                     PDFParser::QueryDictionaryObject
                                               (inParser,(PDFDictionary *)pPVar9,(string *)&password
                                               );
                                lengthObject._vptr_RefCountPtr =
                                     (_func_int **)&PTR__RefCountPtr_003a5870;
                                if (password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node.super__List_node_base._M_next !=
                                    (_List_node_base *)psVar2) {
                                  operator_delete(password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                  password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node._M_size + 1);
                                }
                                if (lengthObject.mValue == (PDFObject *)0x0) {
                                  uVar12 = this->mLength;
                                }
                                else {
                                  uVar12 = ComputeByteLength(lengthObject.mValue);
                                }
                                pXVar19 = (XCryptionCommon *)operator_new(0x58);
                                XCryptionCommon::XCryptionCommon(pXVar19);
                                psVar15 = PDFName::GetValue_abi_cxx11_
                                                    (stringsFilterName.super_RefCountPtr<PDFName>.
                                                     mValue);
                                iVar11 = std::__cxx11::string::compare((char *)psVar15);
                                XCryptionCommon::Setup(pXVar19,iVar11 == 0);
                                XCryptionCommon::SetupInitialEncryptionKey
                                          (pXVar19,inPassword,this->mRevision,uVar12,inO,this->mP,
                                           inFileIDPart1,this->mEncryptMetaData);
                                psVar15 = PDFName::GetValue_abi_cxx11_
                                                    (*(PDFName **)
                                                      (cryptFiltersIt.
                                                                                                              
                                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                  .mCurrentPosition._M_node + 1));
                                pcVar5 = (psVar15->_M_dataplus)._M_p;
                                password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next =
                                     (_List_node_base *)psVar2;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&password,pcVar5,
                                           pcVar5 + psVar15->_M_string_length);
                                std::
                                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                                ::
                                _M_insert_unique<std::pair<std::__cxx11::string_const,XCryptionCommon*>>
                                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                                            *)&this->mXcrypts,
                                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                                            *)&password);
                                if (password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node.super__List_node_base._M_next !=
                                    (_List_node_base *)psVar2) {
                                  operator_delete(password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                  password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node._M_size + 1);
                                }
                                RefCountPtr<PDFObject>::~RefCountPtr(&lengthObject);
                                RefCountPtr<PDFName>::~RefCountPtr
                                          (&stringsFilterName.super_RefCountPtr<PDFName>);
                              }
                              RefCountPtr<PDFDictionary>::~RefCountPtr
                                        ((RefCountPtr<PDFDictionary> *)&streamsFilterName);
                            } while (cryptFiltersIt.
                                     super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                     .mCurrentPosition._M_node !=
                                     cryptFiltersIt.
                                     super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                     .mEndPosition._M_node);
                          }
                          pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                          password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&password,"StmF","");
                          pPVar14 = PDFParser::QueryDictionaryObject
                                              (inParser,pPVar13,(string *)&password);
                          streamsFilterName.super_RefCountPtr<PDFName>.mValue =
                               PDFObjectCast<PDFName>(pPVar14);
                          streamsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                               (_func_int **)&PTR__RefCountPtr_003a5978;
                          if (password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next !=
                              (_List_node_base *)psVar2) {
                            operator_delete(password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node.super__List_node_base._M_next,
                                            password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node._M_size + 1);
                          }
                          pPVar13 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                          password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&password,"StrF","");
                          pPVar14 = PDFParser::QueryDictionaryObject
                                              (inParser,pPVar13,(string *)&password);
                          stringsFilterName.super_RefCountPtr<PDFName>.mValue =
                               PDFObjectCast<PDFName>(pPVar14);
                          stringsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                               (_func_int **)&PTR__RefCountPtr_003a5978;
                          if (password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next !=
                              (_List_node_base *)psVar2) {
                            operator_delete(password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node.super__List_node_base._M_next,
                                            password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node._M_size + 1);
                          }
                          if (streamsFilterName.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0)
                          {
                            password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next =
                                 (_List_node_base *)psVar2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&password,"Identity","");
                          }
                          else {
                            psVar15 = PDFName::GetValue_abi_cxx11_
                                                (streamsFilterName.super_RefCountPtr<PDFName>.mValue
                                                );
                            pcVar5 = (psVar15->_M_dataplus)._M_p;
                            password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next =
                                 (_List_node_base *)psVar2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&password,pcVar5,pcVar5 + psVar15->_M_string_length
                                      );
                          }
                          this_00 = &this->mXcrypts;
                          cVar20 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                                   ::find(&this_00->_M_t,(key_type *)&password);
                          p_Var1 = &(this->mXcrypts)._M_t._M_impl.super__Rb_tree_header;
                          if ((_Rb_tree_header *)cVar20._M_node == p_Var1) {
                            pXVar19 = (XCryptionCommon *)0x0;
                          }
                          else {
                            pXVar19 = *(XCryptionCommon **)(cVar20._M_node + 2);
                          }
                          this->mXcryptStreams = pXVar19;
                          if (password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next !=
                              (_List_node_base *)psVar2) {
                            operator_delete(password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node.super__List_node_base._M_next,
                                            password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node._M_size + 1);
                          }
                          if (stringsFilterName.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0)
                          {
                            password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next =
                                 (_List_node_base *)psVar2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&password,"Identity","");
                          }
                          else {
                            psVar15 = PDFName::GetValue_abi_cxx11_
                                                (stringsFilterName.super_RefCountPtr<PDFName>.mValue
                                                );
                            pcVar5 = (psVar15->_M_dataplus)._M_p;
                            password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next =
                                 (_List_node_base *)psVar2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&password,pcVar5,pcVar5 + psVar15->_M_string_length
                                      );
                          }
                          cVar20 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                                   ::find(&this_00->_M_t,(key_type *)&password);
                          if ((_Rb_tree_header *)cVar20._M_node == p_Var1) {
                            pXVar19 = (XCryptionCommon *)0x0;
                          }
                          else {
                            pXVar19 = *(XCryptionCommon **)(cVar20._M_node + 2);
                          }
                          this->mXcryptStrings = pXVar19;
                          if (password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next !=
                              (_List_node_base *)psVar2) {
                            operator_delete(password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node.super__List_node_base._M_next,
                                            password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node._M_size + 1);
                          }
                          cVar20 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                                   ::find(&this_00->_M_t,&scStdCF_abi_cxx11_);
                          if ((_Rb_tree_header *)cVar20._M_node == p_Var1) {
                            pXVar19 = (XCryptionCommon *)0x0;
                          }
                          else {
                            pXVar19 = *(XCryptionCommon **)(cVar20._M_node + 2);
                          }
                          this->mXcryptAuthentication = pXVar19;
                          RefCountPtr<PDFName>::~RefCountPtr
                                    (&stringsFilterName.super_RefCountPtr<PDFName>);
                          RefCountPtr<PDFName>::~RefCountPtr
                                    (&streamsFilterName.super_RefCountPtr<PDFName>);
                        }
                        RefCountPtr<PDFDictionary>::~RefCountPtr
                                  ((RefCountPtr<PDFDictionary> *)&idPart1ObjectHelper);
                      }
                      else {
                        pXVar19 = (XCryptionCommon *)operator_new(0x58);
                        XCryptionCommon::XCryptionCommon(pXVar19);
                        XCryptionCommon::Setup(pXVar19,false);
                        XCryptionCommon::SetupInitialEncryptionKey
                                  (pXVar19,inPassword,this->mRevision,this->mLength,inO,this->mP,
                                   inFileIDPart1,this->mEncryptMetaData);
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&password,scStdCF_abi_cxx11_._M_dataplus._M_p,
                                   scStdCF_abi_cxx11_._M_dataplus._M_p +
                                   scStdCF_abi_cxx11_._M_string_length);
                        std::
                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                        ::_M_insert_unique<std::pair<std::__cxx11::string_const,XCryptionCommon*>>
                                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                                    *)&this->mXcrypts,
                                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                                    *)&password);
                        if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)psVar2) {
                          operator_delete(password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node.super__List_node_base._M_next,
                                          password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node._M_size + 1);
                        }
                        this->mXcryptStreams = pXVar19;
                        this->mXcryptStrings = pXVar19;
                        this->mXcryptAuthentication = pXVar19;
                      }
                      XCryptionCommon::stringToByteList(&password,inPassword);
                      bVar10 = AuthenticateOwnerPassword(this,&password);
                      this->mDidSucceedOwnerPasswordVerification = bVar10;
                      if (bVar10) {
                        bVar10 = false;
                      }
                      else {
                        bVar10 = AuthenticateUserPassword(this,&password);
                        bVar10 = !bVar10;
                      }
                      this->mFailedPasswordVerification = bVar10;
                      this->mSupportsDecryption = true;
                      p_Var8 = password.
                               super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl._M_node.super__List_node_base._M_next;
                      while (p_Var8 != (_List_node_base *)&password) {
                        p_Var6 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                        operator_delete(p_Var8,0x18);
                        p_Var8 = p_Var6;
                      }
                      RefCountPtr<PDFObject>::~RefCountPtr(&length);
                      RefCountPtr<PDFArray>::~RefCountPtr(&idArray.super_RefCountPtr<PDFArray>);
                      RefCountPtr<PDFBoolean>::~RefCountPtr
                                (&encryptMetadata.super_RefCountPtr<PDFBoolean>);
                    }
                    else {
                      ParsedPrimitiveHelper::~ParsedPrimitiveHelper
                                ((ParsedPrimitiveHelper *)&password);
                    }
                  }
                  RefCountPtr<PDFObject>::~RefCountPtr(&p);
                }
                RefCountPtr<PDFObject>::~RefCountPtr(&u);
              }
              RefCountPtr<PDFObject>::~RefCountPtr(&o);
            }
            else {
              ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
            }
          }
          RefCountPtr<PDFObject>::~RefCountPtr(&revision);
        }
        else {
          ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
        }
      }
      RefCountPtr<PDFObject>::~RefCountPtr(&v);
    }
    else {
      if (filter.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0) goto LAB_00201c63;
      pTVar16 = Trace::DefaultTrace();
      psVar15 = PDFName::GetValue_abi_cxx11_(filter.super_RefCountPtr<PDFName>.mValue);
      std::__cxx11::string::substr((ulong)&password,(ulong)psVar15);
      Trace::TraceToLog(pTVar16,
                        "DecryptionHelper::Setup, Only Standard encryption filter is supported. Unsupported filter encountered - %s"
                        ,password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl._M_node.super__List_node_base._M_next);
      if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next,
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node._M_size + 1);
      }
    }
  }
  RefCountPtr<PDFName>::~RefCountPtr(&filter.super_RefCountPtr<PDFName>);
LAB_002029c7:
  RefCountPtr<PDFDictionary>::~RefCountPtr(&encryptionDictionary.super_RefCountPtr<PDFDictionary>);
  return eSuccess;
}

Assistant:

EStatusCode DecryptionHelper::Setup(PDFParser* inParser, const string& inPassword) {
	mSupportsDecryption = false;
	mFailedPasswordVerification = false;
	mDidSucceedOwnerPasswordVerification = false;
	mParser = inParser;

	// setup encrypted flag through the existance of encryption dict
	PDFObjectCastPtr<PDFDictionary> encryptionDictionary(inParser->QueryDictionaryObject(inParser->GetTrailer(), "Encrypt"));
	mIsEncrypted = encryptionDictionary.GetPtr() != NULL;

	do {
		if (!mIsEncrypted)
			break;

		PDFObjectCastPtr<PDFName> filter(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "Filter"));
		if (!filter || filter->GetValue() != "Standard") {
			// Supporting only standard filter
			if(!filter)
				TRACE_LOG("DecryptionHelper::Setup, no filter defined");
			else
				TRACE_LOG1("DecryptionHelper::Setup, Only Standard encryption filter is supported. Unsupported filter encountered - %s",filter->GetValue().substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}

		RefCountPtr<PDFObject> v(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "V"));
		if (!v) {
			mV = 0;
		} else {
			ParsedPrimitiveHelper vHelper(v.GetPtr());
			if (!vHelper.IsNumber())
				break;
			mV = (unsigned int)vHelper.GetAsInteger();
		}

		// supporting versions 1,2 and 4
		if (mV != 1 && mV != 2 && mV != 4) {
			TRACE_LOG1("DecryptionHelper::Setup, Only 1 and 2 are supported values for V. Unsupported filter encountered - %d", mV);
			break;
		}

		RefCountPtr<PDFObject> revision(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "R"));
		if (!revision) {
			break;
		}
		else {
			ParsedPrimitiveHelper revisionHelper(revision.GetPtr());
			if (!revisionHelper.IsNumber())
				break;
			mRevision = (unsigned int)revisionHelper.GetAsInteger();
		}

		RefCountPtr<PDFObject> o(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "O"));
		if (!o) {
			break;
		}
		else {
			ParsedPrimitiveHelper oHelper(o.GetPtr());
			mO = XCryptionCommon::stringToByteList(oHelper.ToString());
		}

		RefCountPtr<PDFObject> u(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "U"));
		if (!u) {
			break;
		}
		else {
			ParsedPrimitiveHelper uHelper(u.GetPtr());
			mU = XCryptionCommon::stringToByteList(uHelper.ToString());
		}

		RefCountPtr<PDFObject> p(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "P"));
		if (!p) {
			break;
		}
		else {
			ParsedPrimitiveHelper pHelper(p.GetPtr());
			if (!pHelper.IsNumber())
				break;
			mP = pHelper.GetAsInteger();
		}

		PDFObjectCastPtr<PDFBoolean> encryptMetadata(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "EncryptMetadata"));
		if (!encryptMetadata) {
			mEncryptMetaData = true;
		}
		else {
			mEncryptMetaData = encryptMetadata->GetValue();
		}

		// grab file ID from trailer
		mFileIDPart1 = ByteList();
		PDFObjectCastPtr<PDFArray> idArray(inParser->QueryDictionaryObject(inParser->GetTrailer(), "ID"));
		if (!!idArray && idArray->GetLength() > 0) {
			RefCountPtr<PDFObject> idPart1Object(inParser->QueryArrayObject(idArray.GetPtr(), 0));
			if (!!idPart1Object) {
				ParsedPrimitiveHelper idPart1ObjectHelper(idPart1Object.GetPtr());
				mFileIDPart1 = XCryptionCommon::stringToByteList(idPart1ObjectHelper.ToString());
			}
		}


		RefCountPtr<PDFObject> length(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "Length"));
		if (!length) {
			mLength = 40 / 8;
		}
		else {
			mLength = ComputeByteLength(length.GetPtr());
		}

		// Setup crypt filters, or a default filter
		if (mV == 4) {
			// multiple xcryptions. read crypt filters, determine which does what
			PDFObjectCastPtr<PDFDictionary> cryptFilters(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "CF"));
			if (!!cryptFilters) {
				MapIterator<PDFNameToPDFObjectMap>  cryptFiltersIt = cryptFilters->GetIterator();

				// read crypt filters
				while (cryptFiltersIt.MoveNext())
				{
					PDFObjectCastPtr<PDFDictionary> cryptFilter;
					// A little caveat of those smart ptrs need to be handled here
					// make sure to pass the pointer after init...otherwise cast wont do addref
					// and object will be released
					cryptFilter = cryptFiltersIt.GetValue();
					if (!!cryptFilter) {
						PDFObjectCastPtr<PDFName> cfmName(inParser->QueryDictionaryObject(cryptFilter.GetPtr(), "CFM"));
						RefCountPtr<PDFObject> lengthObject(inParser->QueryDictionaryObject(cryptFilter.GetPtr(), "Length"));
						unsigned int length = !lengthObject ? mLength : ComputeByteLength(lengthObject.GetPtr());

						XCryptionCommon* encryption = new XCryptionCommon();
						encryption->Setup(cfmName->GetValue() == "AESV2"); // singe xcryptions are always RC4
						encryption->SetupInitialEncryptionKey(
							inPassword,
							mRevision,
							length,
							mO,
							mP,
							mFileIDPart1,
							mEncryptMetaData);
						mXcrypts.insert(StringToXCryptionCommonMap::value_type(cryptFiltersIt.GetKey()->GetValue(), encryption));
					}
				}
				

				PDFObjectCastPtr<PDFName> streamsFilterName(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "StmF"));
				PDFObjectCastPtr<PDFName> stringsFilterName(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "StrF"));
				mXcryptStreams = GetFilterForName(mXcrypts, !streamsFilterName ? "Identity": streamsFilterName->GetValue());
				mXcryptStrings = GetFilterForName(mXcrypts, !stringsFilterName ? "Identity" : stringsFilterName->GetValue());
				mXcryptAuthentication = GetFilterForName(mXcrypts, scStdCF);
			}

		}
		else {
			// single xcryption, use as the single encryption source
			XCryptionCommon* defaultEncryption = new XCryptionCommon();
			defaultEncryption->Setup(false); // single xcryptions are always RC4
			defaultEncryption->SetupInitialEncryptionKey(
				inPassword,
				mRevision,
				mLength,
				mO,
				mP,
				mFileIDPart1,
				mEncryptMetaData);

			mXcrypts.insert(StringToXCryptionCommonMap::value_type(scStdCF, defaultEncryption));
			mXcryptStreams = defaultEncryption;
			mXcryptStrings = defaultEncryption;
			mXcryptAuthentication = defaultEncryption;
		}

		// authenticate password, try to determine if user or owner
		ByteList password = XCryptionCommon::stringToByteList(inPassword);
		mDidSucceedOwnerPasswordVerification = AuthenticateOwnerPassword(password);
		mFailedPasswordVerification = !mDidSucceedOwnerPasswordVerification && !AuthenticateUserPassword(password);


		mSupportsDecryption = true;
	}while(false);

	return eSuccess;
}